

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O3

int kvtree_unset(kvtree *hash,char *key)

{
  kvtree_elem_struct *pkVar1;
  kvtree_elem_struct **ppkVar2;
  kvtree_elem *in_RAX;
  kvtree_elem *pkVar3;
  
  if ((hash != (kvtree *)0x0) && (pkVar3 = kvtree_elem_get(hash,key), pkVar3 != (kvtree_elem *)0x0))
  {
    pkVar1 = (pkVar3->pointers).le_next;
    ppkVar2 = (pkVar3->pointers).le_prev;
    if (pkVar1 != (kvtree_elem_struct *)0x0) {
      (pkVar1->pointers).le_prev = ppkVar2;
    }
    *ppkVar2 = pkVar1;
    kvtree_elem_delete(in_RAX);
  }
  return 0;
}

Assistant:

int kvtree_unset(kvtree* hash, const char* key)
{
  if (hash == NULL) {
    return KVTREE_SUCCESS;
  }

  kvtree_elem* elem = kvtree_elem_extract(hash, key);
  if (elem != NULL) {
    kvtree_elem_delete(elem);
  }
  return KVTREE_SUCCESS;
}